

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value_type.c
# Opt level: O0

value value_create_function_closure(function f,void *c)

{
  value pvVar1;
  void *in_RSI;
  function_conflict in_RDI;
  value v;
  undefined8 in_stack_ffffffffffffffe8;
  
  pvVar1 = value_type_create(in_RDI,(size_t)in_RSI,
                             (type_id)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
  if (pvVar1 != (value)0x0) {
    function_bind(in_RDI,in_RSI);
    function_increment_reference(in_RDI);
  }
  return pvVar1;
}

Assistant:

value value_create_function_closure(function f, void *c)
{
	// TODO: Review this for the lock-free implementation!!
	// The functions should be immutable, maybe the binding should be a new type
	// or the bind should be stored in the value instead of in the function

	value v = value_type_create(&f, sizeof(function), TYPE_FUNCTION);

	if (v != NULL)
	{
		function_bind(f, c);
		function_increment_reference(f);
	}

	return v;
}